

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
CreateContextCore(JsRuntimeHandle runtimeHandle,TTDRecorder *_actionEntryPopper,bool inRecordMode,
                 bool activelyRecording,bool inReplayMode,JsContextRef *newContext)

{
  DWORD *pDVar1;
  ThreadContext *threadContext;
  ScriptContext *pSVar2;
  ProbeContainer *this;
  bool bVar3;
  bool debugMode;
  JsrtRuntime *runtime;
  JsrtContext *externalCtx;
  JsrtDebugManager *this_00;
  DebugContext *this_01;
  JsErrorCode JVar4;
  undefined1 local_90 [8];
  HostScriptContextCallbackFunctor callbackFunctor;
  ThreadContextScope scope;
  EventLogEntry *local_48;
  
  runtime = JsrtRuntime::FromHandle(runtimeHandle);
  threadContext = runtime->threadContext;
  if ((threadContext->recycler != (Recycler *)0x0) &&
     (bVar3 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler), bVar3)) {
    return JsErrorHeapEnumInProgress;
  }
  JVar4 = JsErrorInThreadServiceCallback;
  if ((threadContext->threadService).isInCallback == false) {
    ThreadContextScope::ThreadContextScope
              ((ThreadContextScope *)&callbackFunctor.pfOnBPClearDocumentCallback,threadContext);
    JVar4 = JsErrorWrongThread;
    if (callbackFunctor.pfOnBPClearDocumentCallback._1_1_ == '\x01') {
      if (activelyRecording) {
        local_48 = TTD::EventLog::RecordJsRTCreateScriptContext
                             (threadContext->TTDLog,_actionEntryPopper);
      }
      else {
        local_48 = (EventLogEntry *)0x0;
      }
      externalCtx = JsrtContext::New(runtime);
      if (inReplayMode || inRecordMode) {
        pSVar2 = (((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                 .ptr;
        callbackFunctor.HostRuntime = OnScriptLoad_TTDCallback;
        callbackFunctor.pfOnScriptLoadCallback = OnBPRegister_TTDCallback;
        callbackFunctor.pfOnBPRegisterCallback = OnBPDelete_TTDCallback;
        callbackFunctor.pfOnBPDeleteCallback = OnBPClearDocument_TTDCallback;
        local_90 = (undefined1  [8])externalCtx;
        callbackFunctor.HostContext = (FinalizableObject *)runtime;
        bVar3 = TTD::EventLog::IsDebugModeFlagSet(threadContext->TTDLog);
        debugMode = TTD::EventLog::IsDebugModeFlagSet(threadContext->TTDLog);
        TTD::EventLog::PushMode(threadContext->TTDLog,ExcludedExecutionTTAction);
        if (inRecordMode) {
          TTD::ThreadContextTTD::AddNewScriptContextRecord
                    (threadContext->TTDContext,&externalCtx->super_FinalizableObject,pSVar2,
                     (HostScriptContextCallbackFunctor *)local_90,bVar3,debugMode);
        }
        else {
          TTD::ThreadContextTTD::AddNewScriptContextReplay
                    (threadContext->TTDContext,&externalCtx->super_FinalizableObject,pSVar2,
                     (HostScriptContextCallbackFunctor *)local_90,bVar3,debugMode);
        }
        TTD::EventLog::SetModeFlagsOnContext(threadContext->TTDLog,pSVar2);
        TTD::EventLog::PopMode(threadContext->TTDLog,ExcludedExecutionTTAction);
      }
      this_00 = JsrtRuntime::GetJsrtDebugManager(runtime);
      if (this_00 != (JsrtDebugManager *)0x0) {
        pDVar1 = &threadContext->debugManager->localsDisplayFlags;
        *pDVar1 = *pDVar1 | 1;
        pSVar2 = (((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                 .ptr;
        this_01 = Js::ScriptContext::GetDebugContext(pSVar2);
        Js::DebugContext::SetHostDebugContext(this_01,&this_00->super_HostDebugContext);
        bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
        if (bVar3) {
          Js::ScriptContext::InitializeDebugging(pSVar2);
          this = this_01->diagProbesContainer;
          Js::ProbeContainer::InitializeInlineBreakEngine(this,&this_00->super_HaltCallback);
          Js::ProbeContainer::InitializeDebuggerScriptOptionCallback
                    (this,&this_00->super_DebuggerOptionsCallback);
        }
        else {
          Js::DebugContext::SetDebuggerMode(this_01,SourceRundown);
        }
      }
      if (activelyRecording) {
        TTD::EventLog::RecordJsRTCreateScriptContextResult
                  (threadContext->TTDLog,local_48,
                   (((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr);
      }
      *newContext = externalCtx;
      JVar4 = JsNoError;
    }
    ThreadContextScope::~ThreadContextScope
              ((ThreadContextScope *)&callbackFunctor.pfOnBPClearDocumentCallback);
  }
  return JVar4;
}

Assistant:

JsErrorCode CreateContextCore(_In_ JsRuntimeHandle runtimeHandle, _In_ TTDRecorder& _actionEntryPopper, _In_ bool inRecordMode, _In_ bool activelyRecording, _In_ bool inReplayMode, _Out_ JsContextRef *newContext)
{
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();

    if(threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if(threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    ThreadContextScope scope(threadContext);

    if(!scope.IsValid())
    {
        return JsErrorWrongThread;
    }

#if ENABLE_TTD
    TTD::NSLogEvents::EventLogEntry* createEvent = nullptr;
    if(activelyRecording)
    {
        createEvent = threadContext->TTDLog->RecordJsRTCreateScriptContext(_actionEntryPopper);
    }
#endif

    JsrtContext * context = JsrtContext::New(runtime);

#if ENABLE_TTD
    if(inRecordMode | inReplayMode)
    {
        Js::ScriptContext* scriptContext = context->GetScriptContext();
        HostScriptContextCallbackFunctor callbackFunctor((FinalizableObject*)context, (void*)runtime, &OnScriptLoad_TTDCallback, &OnBPRegister_TTDCallback, &OnBPDelete_TTDCallback, &OnBPClearDocument_TTDCallback);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
        bool noNative = true;
        bool doDebug = true;
#else
        bool noNative = TTD_FORCE_NOJIT_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
        bool doDebug = TTD_FORCE_DEBUG_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
#endif

        threadContext->TTDLog->PushMode(TTD::TTDMode::ExcludedExecutionTTAction);
        if(inRecordMode)
        {
            threadContext->TTDContext->AddNewScriptContextRecord(context, scriptContext, callbackFunctor, noNative, doDebug);
        }
        else
        {
            threadContext->TTDContext->AddNewScriptContextReplay(context, scriptContext, callbackFunctor, noNative, doDebug);
        }

        threadContext->TTDLog->SetModeFlagsOnContext(scriptContext);
        threadContext->TTDLog->PopMode(TTD::TTDMode::ExcludedExecutionTTAction);
    }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
    JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

    if(jsrtDebugManager != nullptr)
    {
        // JsDiagStartDebugging was called
        threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);

        Js::ScriptContext* scriptContext = context->GetScriptContext();

        Js::DebugContext* debugContext = scriptContext->GetDebugContext();
        debugContext->SetHostDebugContext(jsrtDebugManager);

        if (!jsrtDebugManager->IsDebugEventCallbackSet())
        {
            // JsDiagStopDebugging was called so we need to be in SourceRunDownMode
            debugContext->SetDebuggerMode(Js::DebuggerMode::SourceRundown);
        }
        else
        {
            // Set Debugging mode
            scriptContext->InitializeDebugging();
            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
            probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
        }
    }
#endif

#if ENABLE_TTD
    if(activelyRecording)
    {
        threadContext->TTDLog->RecordJsRTCreateScriptContextResult(createEvent, context->GetScriptContext());
    }
#endif

    *newContext = (JsContextRef)context;
    return JsNoError;
}